

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

int64_t __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  byte *pbVar6;
  pair<bool,_const_unsigned_char_*> pVar7;
  ulong local_150;
  uint local_10c [2];
  uint32_t temp_1;
  pair<bool,_const_unsigned_char_*> p;
  uint32_t temp;
  LogMessage local_e8;
  Voidify local_d1;
  int local_d0;
  uint local_cc;
  Nullable<const_char_*> local_c8;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  CodedInputStream *pCStack_b8;
  uint32_t first_byte_or_zero_local;
  CodedInputStream *this_local;
  bool local_a6;
  bool local_a5;
  int local_a4;
  int local_a0;
  int i;
  uint32_t result;
  uint32_t b;
  uint8_t *ptr;
  Voidify local_79;
  int local_78;
  uint local_74;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  LogMessage local_58;
  Voidify local_41;
  uint local_40;
  uchar local_39;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  uchar *local_28;
  uint local_1c;
  byte local_18;
  uint8_t *local_10;
  
  absl_log_internal_check_op_result._4_4_ = first_byte_or_zero;
  pCStack_b8 = this;
  iVar3 = BufferSize(this);
  if ((iVar3 < 10) &&
     ((this->buffer_end_ <= this->buffer_ || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    bVar2 = ReadVarint32Slow(this,local_10c);
    if (bVar2) {
      local_150 = (ulong)local_10c[0];
    }
    else {
      local_150 = 0xffffffffffffffff;
    }
    return local_150;
  }
  local_cc = absl::lts_20250127::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._4_4_);
  local_d0 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_c8 = absl::lts_20250127::log_internal::Check_NEImpl<unsigned_int,int>
                       (&local_cc,&local_d0,"first_byte_or_zero != 0");
  if (local_c8 != (Nullable<const_char_*>)0x0) {
    pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_c8);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x207,pcVar4);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e8);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar5,(char (*) [64])
                               "Caller should provide us with *buffer_ when buffer is non-empty");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_d1,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_e8);
  }
  local_28 = this->buffer_;
  local_1c = absl_log_internal_check_op_result._4_4_;
  absl_log_internal_check_op_result_1 = (Nullable<const_char_*>)&p.second;
  local_39 = absl::lts_20250127::log_internal::GetReferenceableValue(*local_28);
  local_40 = absl::lts_20250127::log_internal::GetReferenceableValue(local_1c);
  local_38 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_char,unsigned_int>
                       (&local_39,&local_40,"*buffer == first_byte");
  if (local_38 != (Nullable<const_char_*>)0x0) {
    pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_38);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1ae,pcVar4);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  local_74 = absl::lts_20250127::log_internal::GetReferenceableValue(local_1c & 0x80);
  local_78 = absl::lts_20250127::log_internal::GetReferenceableValue(0x80);
  local_70 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,int>
                       (&local_74,&local_78,"first_byte & 0x80 == 0x80");
  if (local_70 != (Nullable<const_char_*>)0x0) {
    pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&ptr,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1af,pcVar4);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&ptr);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,local_1c);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ptr);
  }
  _result = local_28 + 2;
  i = (int)local_28[1];
  local_a0 = i * 0x80 + (local_1c - 0x80);
  if ((local_28[1] & 0x80) != 0) {
    bVar1 = *_result;
    i = (int)bVar1;
    local_a0 = i * 0x4000 + local_a0 + -0x4000;
    _result = local_28 + 3;
    if ((bVar1 & 0x80) != 0) {
      bVar1 = local_28[3];
      i = (int)bVar1;
      local_a0 = i * 0x200000 + local_a0 + -0x200000;
      _result = local_28 + 4;
      if ((bVar1 & 0x80) != 0) {
        _result = local_28 + 5;
        bVar1 = local_28[4];
        i = (int)bVar1;
        local_a0 = i * 0x10000000 + local_a0 + -0x10000000;
        if ((bVar1 & 0x80) != 0) {
          for (local_a4 = 0; local_a4 < 5; local_a4 = local_a4 + 1) {
            pbVar6 = _result + 1;
            bVar1 = *_result;
            i = (int)bVar1;
            _result = pbVar6;
            if ((bVar1 & 0x80) == 0) goto LAB_0051927d;
          }
          local_a5 = false;
          pVar7 = std::make_pair<bool,unsigned_char_const*&>(&local_a5,(uchar **)&result);
          local_10 = pVar7.second;
          local_18 = pVar7.first;
          goto LAB_005192aa;
        }
      }
    }
  }
LAB_0051927d:
  *(int *)absl_log_internal_check_op_result_1 = local_a0;
  local_a6 = true;
  pVar7 = std::make_pair<bool,unsigned_char_const*&>(&local_a6,(uchar **)&result);
  local_10 = pVar7.second;
  local_18 = pVar7.first;
LAB_005192aa:
  if ((local_18 & 1) == 0) {
    this_local = (CodedInputStream *)0xffffffffffffffff;
  }
  else {
    this->buffer_ = local_10;
    this_local = (CodedInputStream *)(ulong)(uint)p.second;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t CodedInputStream::ReadVarint32Fallback(uint32_t first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32_t temp;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32_t temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64_t>(temp) : -1;
  }
}